

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawWarpedDecal(PixelGameEngine *this,Decal *decal,vf2d *pos,Pixel *tint)

{
  initializer_list<olc::v2d_generic<float>_> __l;
  initializer_list<float> __l_00;
  initializer_list<olc::Pixel> __l_01;
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  float fVar4;
  float fVar5;
  float local_190;
  value_type local_174;
  float local_16c;
  int local_168;
  float q;
  int i_1;
  int local_15c;
  float fStack_158;
  int i;
  float d [4];
  olc local_13c [8];
  v2d_generic<float> local_134;
  float local_12c;
  float local_128;
  float sn;
  float rn;
  float rd;
  vf2d center;
  v2d_generic<float> local_110;
  v2d_generic<float> local_108;
  v2d_generic<float> local_100;
  iterator local_f8;
  undefined8 local_f0;
  float local_e8 [4];
  iterator local_d8;
  undefined8 local_d0;
  anon_union_4_2_12391da5_for_Pixel_0 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  anon_union_4_2_12391da5_for_Pixel_0 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [8];
  DecalInstance di;
  Pixel *tint_local;
  vf2d *pos_local;
  Decal *decal_local;
  PixelGameEngine *this_local;
  
  di._104_8_ = tint;
  DecalInstance::DecalInstance((DecalInstance *)local_98);
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  local_b8 = *(anon_union_4_2_12391da5_for_Pixel_0 *)di._104_8_;
  local_b4 = *(undefined4 *)di._104_8_;
  local_b0 = *(undefined4 *)di._104_8_;
  local_ac = *(undefined4 *)di._104_8_;
  local_a8 = &local_b8;
  local_a0 = 4;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)local_a8;
  local_98 = (undefined1  [8])decal;
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator=
            ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
             &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,__l_01);
  local_e8[0] = 1.0;
  local_e8[1] = 1.0;
  local_e8[2] = 1.0;
  local_e8[3] = 1.0;
  local_d8 = local_e8;
  local_d0 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_d8;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &di.uv.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_00);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)&di,4);
  v2d_generic<float>::v2d_generic(&center,0.0,0.0);
  v2d_generic<float>::v2d_generic(&local_110,0.0,1.0);
  v2d_generic<float>::v2d_generic(&local_108,1.0,1.0);
  v2d_generic<float>::v2d_generic(&local_100,1.0,0.0);
  local_f8 = &center;
  local_f0 = 4;
  __l._M_len = 4;
  __l._M_array = local_f8;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::operator=
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             &di.pos.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l);
  v2d_generic<float>::v2d_generic((v2d_generic<float> *)&rn);
  sn = (pos[2].x - pos->x) * (pos[3].y - pos[1].y) + -((pos[3].x - pos[1].x) * (pos[2].y - pos->y));
  if ((sn != 0.0) || (NAN(sn))) {
    sn = 1.0 / sn;
    local_128 = ((pos[3].x - pos[1].x) * (pos->y - pos[1].y) +
                -((pos[3].y - pos[1].y) * (pos->x - pos[1].x))) * sn;
    local_12c = ((pos[2].x - pos->x) * (pos->y - pos[1].y) +
                -((pos[2].y - pos->y) * (pos->x - pos[1].x))) * sn;
    if ((0.0 <= local_128) && (((local_128 <= 1.0 && (0.0 <= local_12c)) && (local_12c <= 1.0)))) {
      v2d_generic<float>::operator-((v2d_generic<float> *)(d + 3),pos + 2);
      olc::operator*(local_13c,&local_128,(v2d_generic<float> *)(d + 3));
      v2d_generic<float>::operator+(&local_134,pos);
      _rn = local_134;
    }
    for (local_15c = 0; local_15c < 4; local_15c = local_15c + 1) {
      v2d_generic<float>::operator-((v2d_generic<float> *)&q,pos + local_15c);
      fVar4 = v2d_generic<float>::mag((v2d_generic<float> *)&q);
      (&fStack_158)[local_15c] = fVar4;
    }
    for (local_168 = 0; local_168 < 4; local_168 = local_168 + 1) {
      if (((&fStack_158)[local_168] != 0.0) || (NAN((&fStack_158)[local_168]))) {
        local_190 = ((&fStack_158)[local_168] + (&fStack_158)[(int)(local_168 + 2U & 3)]) /
                    (&fStack_158)[(int)(local_168 + 2U & 3)];
      }
      else {
        local_190 = 1.0;
      }
      local_16c = local_190;
      pvVar1 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
               operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                           *)&di.pos.
                              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_168);
      v2d_generic<float>::operator*=(pvVar1,&local_16c);
      fVar4 = local_16c;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &di.uv.
                           super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_168);
      *pvVar2 = *pvVar2 * fVar4;
      fVar4 = pos[local_168].x * (this->vInvScreenSize).x;
      fVar5 = pos[local_168].y * (this->vInvScreenSize).y;
      v2d_generic<float>::v2d_generic(&local_174,fVar4 + fVar4 + -1.0,-(fVar5 + fVar5 + -1.0));
      pvVar1 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
               operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                           *)&di,(long)local_168);
      *pvVar1 = local_174;
    }
    di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = this->nDecalMode;
    pvVar3 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                       (&this->vLayers,(ulong)this->nTargetLayer);
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&pvVar3->vecDecalInstance,(value_type *)local_98);
  }
  DecalInstance::~DecalInstance((DecalInstance *)local_98);
  return;
}

Assistant:

void PixelGameEngine::DrawWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::Pixel &tint)
	{
		// Thanks Nathan Reed, a brilliant article explaining whats going on here
		// http://www.reedbeta.com/blog/quadrilateral-interpolation-part-1/
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}